

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O3

int csp_can_add_interface(csp_iface_t *iface)

{
  undefined4 *puVar1;
  int iVar2;
  code *pcVar3;
  
  iVar2 = -2;
  if ((((iface != (csp_iface_t *)0x0) && (iface->name != (char *)0x0)) &&
      (puVar1 = (undefined4 *)iface->interface_data, puVar1 != (undefined4 *)0x0)) &&
     (*(long *)(puVar1 + 2) != 0)) {
    *puVar1 = 0;
    if (csp_conf.version == '\x01') {
      pcVar3 = csp_can1_tx;
    }
    else {
      pcVar3 = csp_can2_tx;
    }
    iface->nexthop = pcVar3;
    csp_iflist_add(iface);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int csp_can_add_interface(csp_iface_t * iface) {

	if ((iface == NULL) || (iface->name == NULL) || (iface->interface_data == NULL)) {
		return CSP_ERR_INVAL;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;
	if (ifdata->tx_func == NULL) {
		return CSP_ERR_INVAL;
	}

	ifdata->cfp_packet_counter = 0;

	if (csp_conf.version == 1) {
		iface->nexthop = csp_can1_tx;
	} else {
		iface->nexthop = csp_can2_tx;
	}

	csp_iflist_add(iface);

	return CSP_ERR_NONE;
}